

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::
SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>>
::emplace_back<int,int>
          (SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
           *this,int *args,int *args_1)

{
  pointer ppVar1;
  SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
  *in_RDI;
  pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> *unaff_retaddr;
  int *in_stack_00000028;
  int *in_stack_00000030;
  pointer in_stack_00000038;
  SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
  *in_stack_00000040;
  SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
  *__y;
  int *in_stack_fffffffffffffff8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
    ::end(in_RDI);
    ppVar1 = emplaceRealloc<int,int>
                       (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  else {
    __y = in_RDI;
    SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
    ::end(in_RDI);
    std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>::
    pair<int,_int,_true>(unaff_retaddr,in_stack_fffffffffffffff8,(int *)__y);
    in_RDI->len = in_RDI->len + 1;
    ppVar1 = SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
             ::back(in_RDI);
  }
  return ppVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }